

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O2

double c_abs(singlecomplex *z)

{
  singlecomplex sVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar7;
  
  sVar1 = *z;
  auVar4._0_8_ = (ulong)sVar1 ^ 0x8000000080000000;
  auVar4._8_4_ = 0x80000000;
  auVar4._12_4_ = 0x80000000;
  auVar2._8_8_ = 0;
  auVar2._0_4_ = sVar1.r;
  auVar2._4_4_ = sVar1.i;
  auVar5 = maxps(auVar4,auVar2);
  fVar3 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  fVar7 = fVar6;
  if (fVar6 <= fVar3) {
    fVar7 = fVar3;
  }
  if ((fVar3 + fVar6 != fVar7) || (NAN(fVar3 + fVar6) || NAN(fVar7))) {
    if (fVar6 <= fVar3) {
      auVar5._0_4_ = fVar6;
    }
    fVar3 = auVar5._0_4_ / fVar7;
    fVar7 = SQRT(fVar3 * fVar3 + 1.0) * fVar7;
  }
  return (double)fVar7;
}

Assistant:

double c_abs(singlecomplex *z)
{
    float temp;
    float real = z->r;
    float imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}